

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O1

void finish_output_bmp(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  uint uVar1;
  FILE *__s;
  jpeg_progress_mgr *pjVar2;
  jpeg_error_mgr *pjVar3;
  JSAMPARRAY ppJVar4;
  JDIMENSION JVar5;
  int iVar6;
  
  __s = (FILE *)dinfo->output_file;
  if (*(int *)&dinfo[1].output_file != 0) {
    pjVar2 = cinfo->progress;
    if (*(int *)&dinfo[1].start_output == 0) {
      write_bmp_header(cinfo,(bmp_dest_ptr)dinfo);
    }
    else {
      write_os2_header(cinfo,(bmp_dest_ptr)dinfo);
    }
    JVar5 = cinfo->output_height;
    if (JVar5 != 0) {
      iVar6 = -JVar5;
      do {
        JVar5 = JVar5 - 1;
        if (pjVar2 != (jpeg_progress_mgr *)0x0) {
          uVar1 = cinfo->output_height;
          pjVar2->pass_counter = (ulong)(uVar1 + iVar6);
          pjVar2->pass_limit = (ulong)uVar1;
          (*pjVar2->progress_monitor)((j_common_ptr)cinfo);
        }
        ppJVar4 = (*cinfo->mem->access_virt_sarray)
                            ((j_common_ptr)cinfo,(jvirt_sarray_ptr)dinfo[1].put_pixel_rows,JVar5,1,0
                            );
        fwrite(*ppJVar4,1,(ulong)*(uint *)((long)&dinfo[1].finish_output + 4),__s);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0);
    }
    if (pjVar2 != (jpeg_progress_mgr *)0x0) {
      *(int *)&pjVar2[1].progress_monitor = *(int *)&pjVar2[1].progress_monitor + 1;
    }
  }
  fflush(__s);
  iVar6 = ferror(__s);
  if (iVar6 != 0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
    return;
  }
  return;
}

Assistant:

METHODDEF(void)
finish_output_bmp(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  bmp_dest_ptr dest = (bmp_dest_ptr)dinfo;
  register FILE *outfile = dest->pub.output_file;
  JSAMPARRAY image_ptr;
  register JSAMPROW data_ptr;
  JDIMENSION row;
  cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;

  if (dest->use_inversion_array) {
    /* Write the header and colormap */
    if (dest->is_os2)
      write_os2_header(cinfo, dest);
    else
      write_bmp_header(cinfo, dest);

    /* Write the file body from our virtual array */
    for (row = cinfo->output_height; row > 0; row--) {
      if (progress != NULL) {
        progress->pub.pass_counter = (long)(cinfo->output_height - row);
        progress->pub.pass_limit = (long)cinfo->output_height;
        (*progress->pub.progress_monitor) ((j_common_ptr)cinfo);
      }
      image_ptr = (*cinfo->mem->access_virt_sarray)
        ((j_common_ptr)cinfo, dest->whole_image, row - 1, (JDIMENSION)1,
         FALSE);
      data_ptr = image_ptr[0];
      (void)JFWRITE(outfile, data_ptr, dest->row_width);
    }
    if (progress != NULL)
      progress->completed_extra_passes++;
  }

  /* Make sure we wrote the output file OK */
  fflush(outfile);
  if (ferror(outfile))
    ERREXIT(cinfo, JERR_FILE_WRITE);
}